

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curve_geometry_device.cpp
# Opt level: O3

void embree::renderTileStandard
               (int taskIndex,int threadIndex,int *pixels,uint width,uint height,float time,
               ISPCCamera *camera,int numTilesX,int numTilesY)

{
  uint uVar1;
  uint y;
  uint uVar2;
  uint height_00;
  uint uVar3;
  float extraout_XMM0_Da;
  
  height_00 = (uint)camera;
  uVar2 = (taskIndex % numTilesX) * 8 + 8;
  if (width <= uVar2) {
    uVar2 = width;
  }
  uVar3 = (taskIndex / numTilesX) * 8 + 8;
  y = taskIndex / numTilesX << 3;
  if (uVar3 < height) {
    height = uVar3;
  }
  if (y < height) {
    uVar1 = taskIndex % numTilesX << 3;
    uVar3 = uVar1;
    do {
      for (; uVar3 < uVar2; uVar3 = uVar3 + 1) {
        renderPixelStandard((TutorialData *)&data,uVar3,y,pixels,width,height_00,time,camera,
                            g_stats + threadIndex);
        time = extraout_XMM0_Da;
      }
      y = y + 1;
      uVar3 = uVar1;
    } while (y != height);
  }
  return;
}

Assistant:

void renderTileStandard(int taskIndex,
                        int threadIndex,
                        int* pixels,
                        const unsigned int width,
                        const unsigned int height,
                        const float time,
                        const ISPCCamera& camera,
                        const int numTilesX,
                        const int numTilesY)
{
  const unsigned int tileY = taskIndex / numTilesX;
  const unsigned int tileX = taskIndex - tileY * numTilesX;
  const unsigned int x0 = tileX * TILE_SIZE_X;
  const unsigned int x1 = min(x0+TILE_SIZE_X,width);
  const unsigned int y0 = tileY * TILE_SIZE_Y;
  const unsigned int y1 = min(y0+TILE_SIZE_Y,height);

  for (unsigned int y=y0; y<y1; y++) for (unsigned int x=x0; x<x1; x++)
  {
    renderPixelStandard(data,x,y,pixels,width,height,time,camera,g_stats[threadIndex]);
  }
}